

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# canvas.cpp
# Opt level: O0

void NULLCCanvas::CanvasClearRGBA(float red,float green,float blue,float alpha,Canvas *ptr)

{
  int local_34;
  int i;
  float fAlpha;
  float fBlue;
  float fGreen;
  float fRed;
  Canvas *ptr_local;
  float alpha_local;
  float blue_local;
  float green_local;
  float red_local;
  
  if (ptr == (Canvas *)0x0) {
    nullcThrowError("ERROR: Canvas object is nullptr");
  }
  else {
    for (local_34 = 0; local_34 < ptr->width * ptr->height; local_34 = local_34 + 1) {
      *(float *)((ptr->data).ptr + (long)(local_34 << 2) * 4) = red / 255.0;
      *(float *)((ptr->data).ptr + (long)(local_34 * 4 + 1) * 4) = green / 255.0;
      *(float *)((ptr->data).ptr + (long)(local_34 * 4 + 2) * 4) = blue / 255.0;
      *(float *)((ptr->data).ptr + (long)(local_34 * 4 + 3) * 4) = alpha / 255.0;
    }
  }
  return;
}

Assistant:

void CanvasClearRGBA(float red, float green, float blue, float alpha, Canvas* ptr)
	{
		if(!ptr)
		{
			nullcThrowError("ERROR: Canvas object is nullptr");
			return;
		}
		float fRed = red / 255.0f;
		float fGreen = green / 255.0f;
		float fBlue = blue / 255.0f;
		float fAlpha = alpha / 255.0f;
		for(int i = 0; i < ptr->width * ptr->height; i++)
		{
			((float*)ptr->data.ptr)[i * 4 + 0] = fRed;
			((float*)ptr->data.ptr)[i * 4 + 1] = fGreen;
			((float*)ptr->data.ptr)[i * 4 + 2] = fBlue;
			((float*)ptr->data.ptr)[i * 4 + 3] = fAlpha;
		}
	}